

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::descriptor_unittest::MiscTest::GetFieldDescriptorOfType(MiscTest *this,Type type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Descriptor *pDVar2;
  DescriptorProto *parent;
  FieldDescriptorProto *pFVar3;
  DescriptorPool *this_00;
  FileDescriptor *pFVar4;
  Nonnull<const_char_*> pcVar5;
  Arena *arena;
  FieldDescriptor *pFVar6;
  size_t sVar7;
  long v2;
  pointer __p;
  char *pcVar8;
  string_view value;
  string_view name;
  string_view value_00;
  FileDescriptorProto file_proto;
  string local_148;
  undefined1 local_128 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_128,(Arena *)0x0);
  local_128[0x10] = local_128[0x10] | 1;
  if ((local_128._8_8_ & 1) != 0) {
    local_128._8_8_ = *(undefined8 *)(local_128._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_128 + 200),value,(Arena *)local_128._8_8_);
  name._M_str = "DummyEnum";
  name._M_len = 9;
  AddEmptyEnum((FileDescriptorProto *)local_128,name);
  paVar1 = &local_148.field_2;
  pcVar8 = "TestMessage";
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"TestMessage","");
  parent = AddMessage((FileDescriptorProto *)local_128,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"foo","");
  pFVar3 = AddField(parent,&local_148,1,FieldDescriptorProto_Label_LABEL_OPTIONAL,type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((type & ~TYPE_DOUBLE) == TYPE_GROUP) {
    *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 4;
    arena = (Arena *)(pFVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    sVar7 = 0xb;
LAB_005fcaa3:
    value_00._M_str = pcVar8;
    value_00._M_len = sVar7;
    protobuf::internal::ArenaStringPtr::Set(&(pFVar3->field_0)._impl_.type_name_,value_00,arena);
  }
  else if (type == TYPE_ENUM) {
    *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 4;
    arena = (Arena *)(pFVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    sVar7 = 9;
    pcVar8 = "DummyEnum";
    goto LAB_005fcaa3;
  }
  this_00 = (DescriptorPool *)operator_new(0x78);
  DescriptorPool::DescriptorPool(this_00);
  local_148._M_dataplus._M_p = (pointer)0x0;
  std::
  __uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::reset((__uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
           *)&this->pool_,this_00);
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&local_148);
  pFVar4 = DescriptorPool::BuildFile
                     ((this->pool_)._M_t.
                      super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                      .super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>._M_head_impl
                      ,(FileDescriptorProto *)local_128);
  if (((pFVar4 != (FileDescriptor *)0x0) && (pFVar4->message_type_count_ == 1)) &&
     (pFVar4->message_types_->field_count_ == 1)) {
    if ((long)pFVar4->message_type_count_ < 1) {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)pFVar4->message_type_count_,"index < message_type_count()");
    }
    else {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      pDVar2 = pFVar4->message_types_;
      v2 = (long)pDVar2->field_count_;
      if (v2 < 1) {
        pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,v2,"index < field_count()");
      }
      else {
        pcVar5 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar5 == (Nonnull<const_char_*>)0x0) {
        pFVar6 = pDVar2->fields_;
        goto LAB_005fcb3f;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar5);
    }
    else {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xae7,pcVar5);
    }
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_148);
  }
  pFVar6 = (FieldDescriptor *)0x0;
LAB_005fcb3f:
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_128);
  return pFVar6;
}

Assistant:

const FieldDescriptor* GetFieldDescriptorOfType(FieldDescriptor::Type type) {
    FileDescriptorProto file_proto;
    file_proto.set_name("foo.proto");
    AddEmptyEnum(&file_proto, "DummyEnum");

    DescriptorProto* message = AddMessage(&file_proto, "TestMessage");
    FieldDescriptorProto* field = AddField(
        message, "foo", 1, FieldDescriptorProto::LABEL_OPTIONAL,
        static_cast<FieldDescriptorProto::Type>(static_cast<int>(type)));

    if (type == FieldDescriptor::TYPE_MESSAGE ||
        type == FieldDescriptor::TYPE_GROUP) {
      field->set_type_name("TestMessage");
    } else if (type == FieldDescriptor::TYPE_ENUM) {
      field->set_type_name("DummyEnum");
    }

    // Build the descriptors and get the pointers.
    pool_ = std::make_unique<DescriptorPool>();
    const FileDescriptor* file = pool_->BuildFile(file_proto);

    if (file != nullptr && file->message_type_count() == 1 &&
        file->message_type(0)->field_count() == 1) {
      return file->message_type(0)->field(0);
    } else {
      return nullptr;
    }
  }